

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::StreamingConcatenationExpressionSyntax::StreamingConcatenationExpressionSyntax
          (StreamingConcatenationExpressionSyntax *this,Token openBrace,Token operatorToken,
          ExpressionSyntax *sliceSize,Token innerOpenBrace,
          SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *expressions,
          Token innerCloseBrace,Token closeBrace)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  StreamExpressionSyntax *pSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t index;
  
  uVar5 = operatorToken._0_8_;
  uVar6 = openBrace._0_8_;
  (this->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)0x0;
  (this->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       StreamingConcatenationExpression;
  (this->openBrace).kind = (short)uVar6;
  (this->openBrace).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->openBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->openBrace).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->openBrace).info = openBrace.info;
  (this->operatorToken).kind = (short)uVar5;
  (this->operatorToken).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->operatorToken).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->operatorToken).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->operatorToken).info = operatorToken.info;
  this->sliceSize = sliceSize;
  (this->innerOpenBrace).kind = innerOpenBrace.kind;
  (this->innerOpenBrace).field_0x2 = innerOpenBrace._2_1_;
  (this->innerOpenBrace).numFlags = (NumericTokenFlags)innerOpenBrace.numFlags.raw;
  (this->innerOpenBrace).rawLen = innerOpenBrace.rawLen;
  (this->innerOpenBrace).info = innerOpenBrace.info;
  SVar2 = (expressions->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(expressions->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent =
       (expressions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->expressions).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->expressions).super_SyntaxListBase.childCount =
       (expressions->super_SyntaxListBase).childCount;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0050bd00;
  sVar1 = (expressions->elements).size_;
  (this->expressions).elements.data_ = (expressions->elements).data_;
  (this->expressions).elements.size_ = sVar1;
  (this->innerCloseBrace).kind = innerCloseBrace.kind;
  (this->innerCloseBrace).field_0x2 = innerCloseBrace._2_1_;
  (this->innerCloseBrace).numFlags = (NumericTokenFlags)innerCloseBrace.numFlags.raw;
  (this->innerCloseBrace).rawLen = innerCloseBrace.rawLen;
  (this->innerCloseBrace).info = innerCloseBrace.info;
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  (this->closeBrace).info = closeBrace.info;
  if (sliceSize != (ExpressionSyntax *)0x0) {
    (sliceSize->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->expressions).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pSVar4 = SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::operator[]
                         (&this->expressions,index);
      (pSVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  return;
}

Assistant:

StreamingConcatenationExpressionSyntax(Token openBrace, Token operatorToken, ExpressionSyntax* sliceSize, Token innerOpenBrace, const SeparatedSyntaxList<StreamExpressionSyntax>& expressions, Token innerCloseBrace, Token closeBrace) :
        PrimaryExpressionSyntax(SyntaxKind::StreamingConcatenationExpression), openBrace(openBrace), operatorToken(operatorToken), sliceSize(sliceSize), innerOpenBrace(innerOpenBrace), expressions(expressions), innerCloseBrace(innerCloseBrace), closeBrace(closeBrace) {
        if (this->sliceSize) this->sliceSize->parent = this;
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
    }